

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O0

GuardBuilder * __thiscall
r_exec::CTPX::find_guard_builder(CTPX *this,_Fact *cause,_Fact *consequent,uint64_t period)

{
  bool bVar1;
  byte bVar2;
  short sVar3;
  int iVar4;
  undefined4 extraout_var;
  _Fact *p_Var6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 *puVar7;
  float *pfVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uint64_t uVar9;
  Code *pCVar10;
  uint64_t uVar11;
  uint16_t index;
  uint16_t index_00;
  uint16_t index_01;
  uint16_t index_02;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar12;
  undefined8 extraout_RDX_01;
  float fVar13;
  float fVar14;
  float fVar15;
  float local_128;
  uint64_t offset;
  uint64_t offset_2;
  uint64_t offset_1;
  float searched_for_1;
  float q1_1;
  float q0_1;
  float _s_2;
  Atom s_2;
  float _s_1;
  Atom s_1;
  int iStack_68;
  uint16_t i_1;
  float _s;
  undefined4 local_54;
  ushort local_4e;
  Atom s;
  uint16_t i;
  uint16_t cmd_arg_count;
  uint16_t cmd_arg_set_index;
  float searched_for;
  float q1;
  float q0;
  uint16_t opcode;
  Code *cause_payload;
  uint64_t period_local;
  _Fact *consequent_local;
  _Fact *cause_local;
  CTPX *this_local;
  long *plVar5;
  
  iVar4 = (*(cause->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(cause,0);
  plVar5 = (long *)CONCAT44(extraout_var,iVar4);
  (**(code **)(*plVar5 + 0x20))(plVar5,0);
  sVar3 = r_code::Atom::asOpcode();
  if (sVar3 == Opcodes::Cmd) {
    p_Var6 = core::P<r_exec::_Fact>::operator->(&(this->super__TPX).super_TPX.target);
    iVar4 = (*(p_Var6->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[9])(p_Var6,0);
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x20))
              ((long *)CONCAT44(extraout_var_00,iVar4),3);
    fVar13 = (float)r_code::Atom::asFloat();
    iVar4 = (*(consequent->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
              super_LObject.super_Code.super__Object._vptr__Object[9])(consequent,0);
    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x20))
              ((long *)CONCAT44(extraout_var_01,iVar4),3);
    fVar14 = (float)r_code::Atom::asFloat();
    (**(code **)(*plVar5 + 0x20))(plVar5,2);
    _s_1._2_2_ = r_code::Atom::asIndex();
    (**(code **)(*plVar5 + 0x20))(plVar5,_s_1._2_2_,extraout_RDX,_s_1._2_2_);
    bVar2 = r_code::Atom::getAtomCount();
    _s = (ushort)bVar2;
    uVar12 = extraout_RDX_00;
    for (local_4e = 1; local_4e <= _s; local_4e = local_4e + 1) {
      puVar7 = (undefined4 *)
               (**(code **)(*plVar5 + 0x20))
                         (plVar5,(short)((uint)_s_1._2_2_ + (uint)local_4e),uVar12,
                          (uint)_s_1._2_2_ + (uint)local_4e);
      local_54 = *puVar7;
      bVar2 = r_code::Atom::isFloat();
      if ((bVar2 & 1) == 0) {
        iStack_68 = 4;
      }
      else {
        fVar15 = (float)r_code::Atom::asFloat();
        bVar2 = r_code::Utils::Equal((double)fVar15,(double)(fVar14 - fVar13));
        if ((bVar2 & 1) == 0) {
          iStack_68 = 0;
        }
        else {
          this_local = (CTPX *)operator_new(0x20);
          ACGuardBuilder::ACGuardBuilder((ACGuardBuilder *)this_local,period,_s_1._2_2_ + local_4e);
          iStack_68 = 1;
        }
      }
      r_code::Atom::~Atom((Atom *)&local_54);
      if ((iStack_68 != 0) && (iStack_68 == 1)) {
        return (GuardBuilder *)this_local;
      }
      uVar12 = extraout_RDX_01;
    }
    if ((fVar13 != 0.0) || (NAN(fVar13))) {
      while (_s_1._2_2_ = _s_1._2_2_ + 1, _s_1._2_2_ <= _s) {
        puVar7 = (undefined4 *)(**(code **)(*plVar5 + 0x20))(plVar5,_s_1._2_2_);
        _s_2 = *puVar7;
        bVar2 = r_code::Atom::isFloat();
        if ((bVar2 & 1) == 0) {
          iStack_68 = 7;
        }
        else {
          _s_2 = (float)r_code::Atom::asFloat();
          bVar2 = r_code::Utils::Equal((double)_s_2,(double)(fVar14 / fVar13));
          if ((bVar2 & 1) == 0) {
            iStack_68 = 0;
          }
          else {
            this_local = (CTPX *)operator_new(0x20);
            MCGuardBuilder::MCGuardBuilder((MCGuardBuilder *)this_local,period,(double)_s_1._2_2_);
            iStack_68 = 1;
          }
        }
        r_code::Atom::~Atom(&s_2);
        if ((iStack_68 != 0) && (iStack_68 == 1)) {
          return (GuardBuilder *)this_local;
        }
      }
    }
  }
  else if (sVar3 == Opcodes::MkVal) {
    pfVar8 = (float *)(**(code **)(*plVar5 + 0x20))(plVar5,3);
    q0_1 = *pfVar8;
    bVar2 = r_code::Atom::isFloat();
    if ((bVar2 & 1) == 0) {
      bVar1 = false;
    }
    else {
      fVar13 = (float)r_code::Atom::asFloat();
      p_Var6 = core::P<r_exec::_Fact>::operator->(&(this->super__TPX).super_TPX.target);
      iVar4 = (*(p_Var6->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
                .super_Code.super__Object._vptr__Object[9])(p_Var6,0);
      (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x20))
                ((long *)CONCAT44(extraout_var_02,iVar4),3);
      fVar14 = (float)r_code::Atom::asFloat();
      iVar4 = (*(consequent->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                super_LObject.super_Code.super__Object._vptr__Object[9])(consequent,0);
      (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0x20))
                ((long *)CONCAT44(extraout_var_03,iVar4),3);
      fVar15 = (float)r_code::Atom::asFloat();
      local_128 = (float)period;
      bVar2 = r_code::Utils::Equal((double)fVar13,(double)((fVar15 - fVar14) / local_128));
      if ((bVar2 & 1) == 0) {
        if ((fVar14 != 0.0) || (NAN(fVar14))) {
          uVar9 = r_code::Utils::GetTimestamp<r_code::Code>((Utils *)cause,(Code *)0x2,index);
          pCVar10 = core::P::operator_cast_to_Code_((P *)&(this->super__TPX).super_TPX.target);
          uVar11 = r_code::Utils::GetTimestamp<r_code::Code>((Utils *)pCVar10,(Code *)0x2,index_01);
          this_local = (CTPX *)operator_new(0x28);
          MGuardBuilder::MGuardBuilder
                    ((MGuardBuilder *)this_local,period,(double)(fVar15 / fVar14),uVar9 - uVar11);
          bVar1 = true;
        }
        else {
          uVar9 = r_code::Utils::GetTimestamp<r_code::Code>((Utils *)cause,(Code *)0x2,index);
          pCVar10 = core::P::operator_cast_to_Code_((P *)&(this->super__TPX).super_TPX.target);
          uVar11 = r_code::Utils::GetTimestamp<r_code::Code>((Utils *)pCVar10,(Code *)0x2,index_02);
          this_local = (CTPX *)operator_new(0x28);
          AGuardBuilder::AGuardBuilder
                    ((AGuardBuilder *)this_local,period,(double)(fVar15 - fVar14),uVar9 - uVar11);
          bVar1 = true;
        }
      }
      else {
        uVar9 = r_code::Utils::GetTimestamp<r_code::Code>((Utils *)cause,(Code *)0x2,index);
        pCVar10 = core::P::operator_cast_to_Code_((P *)&(this->super__TPX).super_TPX.target);
        uVar11 = r_code::Utils::GetTimestamp<r_code::Code>((Utils *)pCVar10,(Code *)0x2,index_00);
        this_local = (CTPX *)operator_new(0x20);
        SGuardBuilder::SGuardBuilder((SGuardBuilder *)this_local,period,period - (uVar9 - uVar11));
        bVar1 = true;
      }
    }
    r_code::Atom::~Atom((Atom *)&q0_1);
    if (bVar1) {
      return (GuardBuilder *)this_local;
    }
  }
  return (GuardBuilder *)(CTPX *)0x0;
}

Assistant:

GuardBuilder *CTPX::find_guard_builder(_Fact *cause, _Fact *consequent, uint64_t period)
{
    Code *cause_payload = cause->get_reference(0);
    uint16_t opcode = cause_payload->code(0).asOpcode();

    if (opcode == Opcodes::Cmd) { // form 0.
        float q0 = target->get_reference(0)->code(MK_VAL_VALUE).asFloat();
        float q1 = consequent->get_reference(0)->code(MK_VAL_VALUE).asFloat();
        float searched_for = q1 - q0;
        uint16_t cmd_arg_set_index = cause_payload->code(CMD_ARGS).asIndex();
        uint16_t cmd_arg_count = cause_payload->code(cmd_arg_set_index).getAtomCount();

        for (uint16_t i = 1; i <= cmd_arg_count; ++i) {
            Atom s = cause_payload->code(cmd_arg_set_index + i);

            if (!s.isFloat()) {
                continue;
            }

            float _s = s.asFloat();

            if (Utils::Equal(_s, searched_for)) {
                return new ACGuardBuilder(period, cmd_arg_set_index + i);
            }
        }

        if (q0 != 0) {
            searched_for = q1 / q0;

            for (uint16_t i = cmd_arg_set_index + 1; i <= cmd_arg_count; ++i) {
                Atom s = cause_payload->code(i);

                if (!s.isFloat()) {
                    continue;
                }

                float _s = s.asFloat();

                if (Utils::Equal(_s, searched_for)) {
                    return new MCGuardBuilder(period, i);
                }
            }
        }
    } else if (opcode == Opcodes::MkVal) {
        Atom s = cause_payload->code(MK_VAL_VALUE);

        if (s.isFloat()) {
            float _s = s.asFloat();
            float q0 = target->get_reference(0)->code(MK_VAL_VALUE).asFloat();
            float q1 = consequent->get_reference(0)->code(MK_VAL_VALUE).asFloat();
            float searched_for = (q1 - q0) / period;

            if (Utils::Equal(_s, searched_for)) { // form 1.
                uint64_t offset = Utils::GetTimestamp<Code>(cause, FACT_AFTER) - Utils::GetTimestamp<Code>(target, FACT_AFTER);
                return new SGuardBuilder(period, period - offset);
            }

            if (q0 != 0) { // form 2.
                uint64_t offset = Utils::GetTimestamp<Code>(cause, FACT_AFTER) - Utils::GetTimestamp<Code>(target, FACT_AFTER);
                return new MGuardBuilder(period, q1 / q0, offset);
            }

            uint64_t offset = Utils::GetTimestamp<Code>(cause, FACT_AFTER) - Utils::GetTimestamp<Code>(target, FACT_AFTER);
            return new AGuardBuilder(period, q1 - q0, offset);
        }
    }

    return nullptr;
}